

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

int __thiscall QTabBarPrivate::selectNewCurrentIndexFrom(QTabBarPrivate *this,int fromIndex)

{
  Tab **ppTVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (this->tabList).d.size;
  lVar4 = (long)fromIndex;
  iVar3 = -1;
  if (lVar4 < lVar5) {
    ppTVar1 = (this->tabList).d.ptr;
    lVar6 = lVar4;
    do {
      if (((ppTVar1[lVar6]->field_0xe4 & 2) != 0) && ((ppTVar1[lVar6]->field_0xe4 & 1) != 0)) {
        iVar3 = (int)lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar5);
  }
  if (0 < fromIndex && iVar3 < 0) {
    ppTVar1 = (this->tabList).d.ptr;
    do {
      lVar5 = lVar4 + -1;
      if (((ppTVar1[lVar5]->field_0xe4 & 2) != 0) && ((ppTVar1[lVar5]->field_0xe4 & 1) != 0)) {
        return (int)lVar5;
      }
      bVar2 = 1 < lVar4;
      lVar4 = lVar5;
    } while (bVar2);
  }
  return iVar3;
}

Assistant:

int QTabBarPrivate::selectNewCurrentIndexFrom(int fromIndex)
{
    int newindex = -1;
    for (int i = fromIndex; i < tabList.size(); ++i) {
        if (at(i)->visible && at(i)->enabled) {
          newindex = i;
          break;
        }
    }
    if (newindex < 0) {
        for (int i = fromIndex-1; i > -1; --i) {
            if (at(i)->visible && at(i)->enabled) {
              newindex = i;
              break;
            }
        }
    }

    return newindex;
}